

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int GetLatestDataFromThreadRazorAHRSx(RAZORAHRS *pRazorAHRS,RAZORAHRSDATA *pRazorAHRSData)

{
  int iVar1;
  long lVar2;
  CRITICAL_SECTION *__mutex;
  long lVar3;
  RAZORAHRSDATA *pRVar4;
  byte bVar5;
  
  bVar5 = 0;
  __mutex = RazorAHRSCS;
  pRVar4 = razorahrsdataRazorAHRS;
  lVar3 = 0;
  do {
    if ((RAZORAHRS *)addrsRazorAHRS[lVar3] == pRazorAHRS) {
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
        pRazorAHRSData->yaw = pRVar4->yaw;
        pRVar4 = (RAZORAHRSDATA *)((long)pRVar4 + ((ulong)bVar5 * -2 + 1) * 8);
        pRazorAHRSData = (RAZORAHRSDATA *)((long)pRazorAHRSData + (ulong)bVar5 * -0x10 + 8);
      }
      iVar1 = resRazorAHRS[lVar3];
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return iVar1;
    }
    lVar3 = lVar3 + 1;
    __mutex = __mutex + 1;
    pRVar4 = pRVar4 + 1;
  } while (lVar3 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int GetLatestDataFromThreadRazorAHRSx(RAZORAHRS* pRazorAHRS, RAZORAHRSDATA* pRazorAHRSData)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsRazorAHRS[id] != pRazorAHRS)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	EnterCriticalSection(&RazorAHRSCS[id]);
	*pRazorAHRSData = razorahrsdataRazorAHRS[id];
	res = resRazorAHRS[id];
	LeaveCriticalSection(&RazorAHRSCS[id]);

	return res;
}